

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<bool>::RepeatedField
          (RepeatedField<bool> *this,Arena *arena,RepeatedField<bool> *rhs)

{
  ulong uVar1;
  int new_size;
  bool *__src;
  char *__dest;
  
  internal::ShortSooRep::ShortSooRep((ShortSooRep *)this,arena);
  AnnotateSize(this,3,0);
  uVar1 = (rhs->soo_rep_).field_0.long_rep.elements_int;
  new_size = internal::SooRep::size(&rhs->soo_rep_,(uVar1 & 4) == 0);
  if (new_size != 0) {
    if (3 < new_size) {
      Grow(this,true,0,new_size);
    }
    ExchangeCurrentSize(this,new_size < 4,new_size);
    __src = elements(rhs,(uVar1 & 4) == 0);
    if (new_size < 4) {
      __dest = (char *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      __dest = internal::LongSooRep::elements((LongSooRep *)this);
    }
    memcpy(__dest,__src,(long)new_size);
    return;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena,
                                             const RepeatedField& rhs)
    : soo_rep_(arena) {
  StaticValidityCheck();
  AnnotateSize(kSooCapacityElements, 0);
  const bool rhs_is_soo = rhs.is_soo();
  if (auto size = rhs.size(rhs_is_soo)) {
    bool is_soo = true;
    if (size > kSooCapacityElements) {
      Grow(is_soo, 0, size);
      is_soo = false;
    }
    ExchangeCurrentSize(is_soo, size);
    UninitializedCopyN(rhs.elements(rhs_is_soo), size, unsafe_elements(is_soo));
  }
}